

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chimp_scan.hpp
# Opt level: O0

void __thiscall
duckdb::ChimpScanState<float>::ChimpScanState(ChimpScanState<float> *this,ColumnSegment *segment)

{
  uint uVar1;
  _func_int **pp_Var2;
  data_ptr_t pdVar3;
  idx_t iVar4;
  ColumnSegment *in_RSI;
  SegmentScanState *in_RDI;
  uint metadata_offset;
  data_ptr_t start_of_data_segment;
  data_ptr_t dataptr;
  BufferManager *buffer_manager;
  BufferHandle *in_stack_ffffffffffffff38;
  ChimpGroupState<unsigned_int> *in_stack_ffffffffffffff40;
  __atomic_base<unsigned_long> *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  undefined1 local_40 [24];
  BufferManager *local_28;
  ColumnSegment *local_10;
  
  local_10 = in_RSI;
  SegmentScanState::SegmentScanState(in_RDI);
  in_RDI->_vptr_SegmentScanState = (_func_int **)&PTR__ChimpScanState_0350ec78;
  BufferHandle::BufferHandle
            ((BufferHandle *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  in_RDI[5]._vptr_SegmentScanState = (_func_int **)0x0;
  ChimpGroupState<unsigned_int>::ChimpGroupState((ChimpGroupState<unsigned_int> *)0x9e9d62);
  in_RDI[0x2511]._vptr_SegmentScanState = (_func_int **)local_10;
  pp_Var2 = (_func_int **)
            ::std::__atomic_base::operator_cast_to_unsigned_long(in_stack_ffffffffffffff48);
  in_RDI[0x2512]._vptr_SegmentScanState = pp_Var2;
  local_28 = BufferManager::GetBufferManager((DatabaseInstance *)0x9e9da9);
  (*local_28->_vptr_BufferManager[7])(local_40,local_28,&local_10->block);
  BufferHandle::operator=((BufferHandle *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  BufferHandle::~BufferHandle((BufferHandle *)in_stack_ffffffffffffff40);
  pdVar3 = BufferHandle::Ptr((BufferHandle *)0x9e9e1b);
  ColumnSegment::GetBlockOffset(local_10);
  ChimpGroupState<unsigned_int>::Init
            (in_stack_ffffffffffffff40,(uint8_t *)in_stack_ffffffffffffff38);
  iVar4 = ColumnSegment::GetBlockOffset(local_10);
  uVar1 = Load<unsigned_int>(pdVar3 + iVar4);
  iVar4 = ColumnSegment::GetBlockOffset(local_10);
  in_RDI[4]._vptr_SegmentScanState = (_func_int **)(pdVar3 + uVar1 + iVar4);
  return;
}

Assistant:

explicit ChimpScanState(ColumnSegment &segment) : segment(segment), segment_count(segment.count) {
		auto &buffer_manager = BufferManager::GetBufferManager(segment.db);

		handle = buffer_manager.Pin(segment.block);
		auto dataptr = handle.Ptr();
		// ScanStates never exceed the boundaries of a Segment,
		// but are not guaranteed to start at the beginning of the Block
		auto start_of_data_segment = dataptr + segment.GetBlockOffset() + ChimpPrimitives::HEADER_SIZE;
		group_state.Init(start_of_data_segment);
		auto metadata_offset = Load<uint32_t>(dataptr + segment.GetBlockOffset());
		metadata_ptr = dataptr + segment.GetBlockOffset() + metadata_offset;
	}